

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<long_double,_signed_char>::Run
          (DataTransform<long_double,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  NumericType NVar2;
  WarningType WVar3;
  ostream *poVar4;
  size_t *__idx;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  char local_28c;
  char local_28a;
  char local_284;
  allocator local_281;
  string *local_280;
  long local_278;
  ulong local_270;
  longdouble local_268;
  string local_250;
  string word;
  char buffer [128];
  
  local_280 = &this->print_format_;
  iVar7 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar8 = word._M_string_length == 0;
      lVar10 = in_ST0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        lVar10 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_268 = in_ST0;
      }
      in_ST0 = lVar10;
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_00134c5d;
      if (bVar8) {
        if (bVar8) {
LAB_00134f33:
          bVar8 = true;
          if ((this->is_ascii_output_ == true) && (iVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00134f55:
          bVar8 = false;
        }
        return bVar8;
      }
    }
    else {
      bVar8 = sptk::ReadStream<long_double>(&local_268,input_stream);
      if (!bVar8) goto LAB_00134f33;
LAB_00134c5d:
      local_284 = (char)(short)ROUND(local_268);
      local_28c = this->minimum_value_;
      cVar1 = this->maximum_value_;
      if (local_28c < cVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          in_ST6 = in_ST5;
          if (((longdouble)(short)local_28c <= local_268) &&
             (local_28c = cVar1, local_268 <= (longdouble)(short)cVar1)) goto LAB_00134d90;
        }
        else {
          uVar5 = (ulong)cVar1;
          if (NVar2 == kUnsignedInteger) {
            lVar9 = (longdouble)9.223372e+18;
            lVar10 = (longdouble)0;
            if (lVar9 <= local_268) {
              lVar10 = lVar9;
            }
            local_270 = (ulong)ROUND(local_268 - lVar10);
            uVar6 = (ulong)(lVar9 <= local_268) << 0x3f ^ local_270;
            in_ST5 = in_ST4;
            in_ST6 = in_ST4;
            if ((ulong)(long)local_28c <= uVar6) {
              bVar8 = uVar5 < uVar6;
              local_28c = local_284;
              if (bVar8) {
                local_28c = cVar1;
              }
              goto LAB_00134d95;
            }
          }
          else {
            if (NVar2 != kSignedInteger) goto LAB_00134d90;
            local_278 = (long)ROUND(local_268);
            in_ST6 = in_ST5;
            if (local_28c <= local_278) {
              bVar8 = (long)uVar5 < local_278;
              local_28c = local_284;
              if ((long)uVar5 < local_278) {
                local_28c = cVar1;
              }
              goto LAB_00134d95;
            }
          }
        }
LAB_00134de8:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar4,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_281);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) goto LAB_00134f55;
        }
      }
      else {
LAB_00134d90:
        bVar8 = false;
        local_28c = local_284;
LAB_00134d95:
        if ((bVar8) || (this->rounding_ == false)) {
          if (bVar8) goto LAB_00134de8;
        }
        else {
          in_ST6 = in_ST5;
          if (local_268 <= (longdouble)0) {
            local_28a = (char)(short)ROUND(local_268 + (longdouble)-0.5);
            local_28c = local_28a;
          }
          else {
            local_28c = (char)(short)ROUND(local_268 + (longdouble)0.5);
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<signed_char>(local_28c,local_280,0x80,buffer);
        if (!bVar8) goto LAB_00134f55;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar8 = sptk::WriteStream<signed_char>(local_28c,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar8) goto LAB_00134f55;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }